

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O2

UBool __thiscall
icu_63::MessagePatternList<double,_8>::ensureCapacityForOneMore
          (MessagePatternList<double,_8> *this,int32_t oldLength,UErrorCode *errorCode)

{
  double *pdVar1;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (oldLength < (this->a).capacity) {
      return '\x01';
    }
    pdVar1 = MaybeStackArray<double,_8>::resize(&this->a,oldLength * 2,oldLength);
    if (pdVar1 != (double *)0x0) {
      return '\x01';
    }
    *errorCode = U_MEMORY_ALLOCATION_ERROR;
  }
  return '\0';
}

Assistant:

UBool
MessagePatternList<T, stackCapacity>::ensureCapacityForOneMore(int32_t oldLength, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return FALSE;
    }
    if(a.getCapacity()>oldLength || a.resize(2*oldLength, oldLength)!=NULL) {
        return TRUE;
    }
    errorCode=U_MEMORY_ALLOCATION_ERROR;
    return FALSE;
}